

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O2

void __thiscall HEkk::computePrimalObjectiveValue(HEkk *this)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  pointer piVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pcVar7;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  
  uVar9 = 0;
  HighsSimplexAnalysis::simplexTimerStart(&this->analysis_,0x24,0);
  (this->info_).primal_objective_value = 0.0;
  uVar1 = (this->lp_).num_col_;
  uVar2 = (this->lp_).num_row_;
  piVar4 = (this->basis_).basicIndex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (this->info_).baseValue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar6 = (this->lp_).col_cost_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar8 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar8 = uVar9;
  }
  dVar10 = 0.0;
  for (; uVar8 != uVar9; uVar9 = uVar9 + 1) {
    iVar3 = piVar4[uVar9];
    if (iVar3 < (int)uVar1) {
      dVar10 = dVar10 + pdVar5[uVar9] * pdVar6[iVar3];
      (this->info_).primal_objective_value = dVar10;
    }
  }
  pcVar7 = (this->basis_).nonbasicFlag_.
           super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (this->info_).workValue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar9 = 0;
  uVar8 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar8 = uVar9;
  }
  for (; uVar8 != uVar9; uVar9 = uVar9 + 1) {
    if (pcVar7[uVar9] != '\0') {
      dVar10 = dVar10 + pdVar5[uVar9] * pdVar6[uVar9];
      (this->info_).primal_objective_value = dVar10;
    }
  }
  (this->info_).primal_objective_value = dVar10 * this->cost_scale_ + (this->lp_).offset_;
  (this->status_).has_primal_objective_value = true;
  HighsSimplexAnalysis::simplexTimerStop(&this->analysis_,0x24,0);
  return;
}

Assistant:

void HEkk::computePrimalObjectiveValue() {
  analysis_.simplexTimerStart(ComputePrObjClock);
  info_.primal_objective_value = 0;
  for (HighsInt iRow = 0; iRow < lp_.num_row_; iRow++) {
    HighsInt iVar = basis_.basicIndex_[iRow];
    if (iVar < lp_.num_col_) {
      info_.primal_objective_value +=
          info_.baseValue_[iRow] * lp_.col_cost_[iVar];
    }
  }
  for (HighsInt iCol = 0; iCol < lp_.num_col_; iCol++) {
    if (basis_.nonbasicFlag_[iCol])
      info_.primal_objective_value +=
          info_.workValue_[iCol] * lp_.col_cost_[iCol];
  }
  info_.primal_objective_value *= cost_scale_;
  // Objective value calculation is done using primal values and
  // original costs so offset is vanilla
  info_.primal_objective_value += lp_.offset_;
  // Now have primal objective value
  status_.has_primal_objective_value = true;
  analysis_.simplexTimerStop(ComputePrObjClock);
}